

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  bool bVar1;
  IResultCapture *pIVar2;
  long in_RDI;
  SectionEndInfo endInfo;
  SectionInfo *in_stack_ffffffffffffff68;
  SectionInfo *in_stack_ffffffffffffff70;
  undefined1 local_60 [48];
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  double local_10;
  
  if ((*(byte *)(in_RDI + 0x50) & 1) != 0) {
    SectionInfo::SectionInfo(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_30 = *(undefined8 *)(in_RDI + 0x30);
    uStack_28 = *(undefined8 *)(in_RDI + 0x38);
    local_20 = *(undefined8 *)(in_RDI + 0x40);
    uStack_18 = *(undefined8 *)(in_RDI + 0x48);
    local_10 = Timer::getElapsedSeconds((Timer *)0x192022);
    bVar1 = uncaught_exceptions();
    if (bVar1) {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[5])(pIVar2,local_60);
    }
    else {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[4])(pIVar2,local_60);
    }
    SectionEndInfo::~SectionEndInfo((SectionEndInfo *)0x19209e);
  }
  SectionInfo::~SectionInfo((SectionInfo *)0x1920a8);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo{ CATCH_MOVE(m_info), m_assertions, m_timer.getElapsedSeconds() };
            if ( uncaught_exceptions() ) {
                getResultCapture().sectionEndedEarly( CATCH_MOVE(endInfo) );
            } else {
                getResultCapture().sectionEnded( CATCH_MOVE( endInfo ) );
            }
        }
    }